

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invalid_commandline_tests.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  UnitTestSource *pUVar4;
  Fixed *fixed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  unsigned_long *in_R9;
  string local_f20;
  AssertionHelper local_f00;
  Fixed local_ed0;
  bool local_d41;
  undefined1 local_d40 [8];
  AssertionResult iutest_ar_5;
  string local_ce8;
  Fixed local_cc8;
  size_type local_b40;
  char local_b34 [4];
  undefined1 local_b30 [8];
  AssertionResult iutest_ar_4;
  value_type local_b00;
  allocator<char> local_ad9;
  value_type local_ad8;
  allocator<char> local_ab1;
  value_type local_ab0;
  allocator<char> local_a89;
  value_type local_a88;
  allocator<char> local_a61;
  value_type local_a60;
  allocator<char> local_a39;
  value_type local_a38;
  allocator<char> local_a11;
  value_type local_a10;
  allocator<char> local_9e9;
  value_type local_9e8;
  allocator<char> local_9c1;
  value_type local_9c0;
  allocator<char> local_999;
  value_type local_998;
  allocator<char> local_971;
  value_type local_970;
  allocator<char> local_949;
  value_type local_948;
  allocator<char> local_921;
  value_type local_920;
  allocator<char> local_8f9;
  value_type local_8f8;
  allocator<char> local_8d1;
  value_type local_8d0;
  allocator<char> local_8a9;
  value_type local_8a8;
  allocator<char> local_881;
  value_type local_880;
  undefined1 local_860 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vargv;
  AssertionHelper local_828;
  Fixed local_7f8;
  bool local_669;
  undefined1 local_668 [8];
  AssertionResult iutest_ar_3;
  Fixed local_610;
  int local_484;
  undefined1 local_480 [8];
  AssertionResult iutest_ar_2;
  char *targv_1 [2];
  int local_43c;
  undefined1 local_438 [4];
  int targc_1;
  AssertionHelper local_418;
  Fixed local_3e8;
  bool local_259;
  undefined1 local_258 [8];
  AssertionResult iutest_ar_1;
  Fixed local_200;
  int local_64;
  undefined1 local_60 [8];
  AssertionResult iutest_ar;
  char *targv [2];
  int local_1c;
  char **ppcStack_18;
  int targc;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  iuutil::ReleaseDefaultXmlGenerator();
  local_1c = 2;
  iutest_ar._32_8_ = *ppcStack_18;
  iutest::InitIrisUnitTest(&local_1c,(char **)&iutest_ar.m_result);
  iutest::detail::AlwaysZero();
  local_64 = 2;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_60,"2","targc",&local_64,&local_1c);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    memset(&local_200,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_200);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_60);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
               ,0x30,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_200);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_200);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  iutest::detail::AlwaysZero();
  local_259 = iutest::TestFlag::IsEnableFlag(0x1000000);
  iutest::AssertionResult::Is<bool>((AssertionResult *)local_258,&local_259);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    memset(&local_3e8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3e8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_438,(internal *)local_258,
               (AssertionResult *)"::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)",
               "false","true",(char *)in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iutest::AssertionHelper::AssertionHelper
              (&local_418,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
               ,0x32,pcVar3,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_418,&local_3e8);
    iutest::AssertionHelper::~AssertionHelper(&local_418);
    std::__cxx11::string::~string((string *)local_438);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3e8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  pUVar4 = iutest::UnitTestSource::GetInstance();
  iVar2 = iutest::UnitTestSource::Run(pUVar4);
  if (iVar2 == 0) {
    local_43c = 2;
    iutest_ar_2._32_8_ = *ppcStack_18;
    iutest::InitIrisUnitTest(&local_43c,(char **)&iutest_ar_2.m_result);
    iutest::detail::AlwaysZero();
    local_484 = 2;
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_480,"2","targc",&local_484,&local_43c);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
    if (!bVar1) {
      memset(&local_610,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_610);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_480);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                 ,0x3b,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_610);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_610);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_480);
    iutest::detail::AlwaysZero();
    local_669 = iutest::TestFlag::IsEnableFlag(0x1000000);
    iutest::AssertionResult::Is<bool>((AssertionResult *)local_668,&local_669);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_668);
    if (!bVar1) {
      memset(&local_7f8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_7f8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &vargv.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_668,
                 (AssertionResult *)
                 "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                 (char *)in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      iutest::AssertionHelper::AssertionHelper
                (&local_828,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                 ,0x3c,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=(&local_828,&local_7f8);
      iutest::AssertionHelper::~AssertionHelper(&local_828);
      std::__cxx11::string::~string
                ((string *)
                 &vargv.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iutest::AssertionHelper::Fixed::~Fixed(&local_7f8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_668);
    pUVar4 = iutest::UnitTestSource::GetInstance();
    iVar2 = iutest::UnitTestSource::Run(pUVar4);
    if (iVar2 == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_860);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_880,"--iutest_random_seed",&local_881);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_880);
      std::__cxx11::string::~string((string *)&local_880);
      std::allocator<char>::~allocator(&local_881);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8a8,"--iutest_repeat",&local_8a9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_8a8);
      std::__cxx11::string::~string((string *)&local_8a8);
      std::allocator<char>::~allocator(&local_8a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8d0,"--iutest_stream_result_to",&local_8d1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_8d0);
      std::__cxx11::string::~string((string *)&local_8d0);
      std::allocator<char>::~allocator(&local_8d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8f8,"--iutest_file_location",&local_8f9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_8f8);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::allocator<char>::~allocator(&local_8f9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_920,"--iutest_file_location=xxx",&local_921);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_920);
      std::__cxx11::string::~string((string *)&local_920);
      std::allocator<char>::~allocator(&local_921);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_948,"--iutest_print_time",&local_949);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_948);
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_970,"--iutest_print_time=",&local_971);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_970);
      std::__cxx11::string::~string((string *)&local_970);
      std::allocator<char>::~allocator(&local_971);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_998,"--iutest_catch_exceptions",&local_999);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_998);
      std::__cxx11::string::~string((string *)&local_998);
      std::allocator<char>::~allocator(&local_999);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9c0,"--iutest_color",&local_9c1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_9c0);
      std::__cxx11::string::~string((string *)&local_9c0);
      std::allocator<char>::~allocator(&local_9c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_9e8,"--iutest_color=hoge",&local_9e9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_9e8);
      std::__cxx11::string::~string((string *)&local_9e8);
      std::allocator<char>::~allocator(&local_9e9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a10,"--iutest_shuffle=1",&local_a11);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_a10);
      std::__cxx11::string::~string((string *)&local_a10);
      std::allocator<char>::~allocator(&local_a11);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a38,"--iutest_output",&local_a39);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_a38);
      std::__cxx11::string::~string((string *)&local_a38);
      std::allocator<char>::~allocator(&local_a39);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a60,"--iutest_also_run_disabled_tests=1",&local_a61);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_a60);
      std::__cxx11::string::~string((string *)&local_a60);
      std::allocator<char>::~allocator(&local_a61);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a88,"--iutest_list_tests=1",&local_a89);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_a88);
      std::__cxx11::string::~string((string *)&local_a88);
      std::allocator<char>::~allocator(&local_a89);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,"--iutest_list_tests_with_where=1",&local_ab1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator(&local_ab1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_ad8,"--x",&local_ad9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_ad8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b00,"-x",(allocator<char> *)&iutest_ar_4.field_0x27);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_860,&local_b00);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator((allocator<char> *)&iutest_ar_4.field_0x27);
      iutest::InitIrisUnitTest<char>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_860);
      iutest::detail::AlwaysZero();
      local_b34[0] = '\x11';
      local_b34[1] = '\0';
      local_b34[2] = '\0';
      local_b34[3] = '\0';
      local_b40 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_860);
      iutest::internal::backward::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((AssertionResult *)local_b30,(EqHelper<false> *)"17u","vargv.size()",local_b34,
                 (uint *)&local_b40,in_R9);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b30);
      if (!bVar1) {
        memset(&local_cc8,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_cc8);
        iutest::
        PrintToString<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_ce8,(iutest *)local_860,v);
        fixed = iutest::AssertionHelper::Fixed::operator<<(&local_cc8,&local_ce8);
        pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_b30);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_ar_5.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                   ,0x53,pcVar3,kNonFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,fixed);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
        std::__cxx11::string::~string((string *)&local_ce8);
        iutest::AssertionHelper::Fixed::~Fixed(&local_cc8);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_b30);
      iutest::detail::AlwaysZero();
      local_d41 = iutest::TestFlag::IsEnableFlag(0x1000000);
      iutest::AssertionResult::Is<bool>((AssertionResult *)local_d40,&local_d41);
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d40);
      if (!bVar1) {
        memset(&local_ed0,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_ed0);
        iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                  (&local_f20,(internal *)local_d40,
                   (AssertionResult *)
                   "::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP)","false","true",
                   (char *)in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        iutest::AssertionHelper::AssertionHelper
                  (&local_f00,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/invalid_commandline_tests.cpp"
                   ,0x54,pcVar3,kNonFatalFailure);
        iutest::AssertionHelper::operator=(&local_f00,&local_ed0);
        iutest::AssertionHelper::~AssertionHelper(&local_f00);
        std::__cxx11::string::~string((string *)&local_f20);
        iutest::AssertionHelper::Fixed::~Fixed(&local_ed0);
      }
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_d40);
      pUVar4 = iutest::UnitTestSource::GetInstance();
      iVar2 = iutest::UnitTestSource::Run(pUVar4);
      if (iVar2 != 0) {
        argv_local._4_4_ = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_860);
      if (iVar2 == 0) {
        printf("*** Successful ***\n");
        argv_local._4_4_ = 0;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    (void)argc;
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

    {
        int targc = 2;
        DECAL_ARGV("--gtest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
#if !defined(IUTEST_USE_GTEST)
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
#endif
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#if !defined(IUTEST_USE_GTEST)
    {
        int targc = 2;
        DECAL_ARGV("--iutest_foo");
        IUTEST_INIT(&targc, targv);
        IUTEST_EXPECT_EQ(2, targc);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
    {
        ::std::vector< ::std::string > vargv;
        vargv.push_back("--iutest_random_seed");
        vargv.push_back("--iutest_repeat");
        vargv.push_back("--iutest_stream_result_to");
        vargv.push_back("--iutest_file_location");
        vargv.push_back("--iutest_file_location=xxx");
        vargv.push_back("--iutest_print_time");
        vargv.push_back("--iutest_print_time=");
        vargv.push_back("--iutest_catch_exceptions");
        vargv.push_back("--iutest_color");
        vargv.push_back("--iutest_color=hoge");
        vargv.push_back("--iutest_shuffle=1");
        vargv.push_back("--iutest_output");
        vargv.push_back("--iutest_also_run_disabled_tests=1");
        vargv.push_back("--iutest_list_tests=1");
        vargv.push_back("--iutest_list_tests_with_where=1");
        vargv.push_back("--x");
        vargv.push_back("-x");
        ::iutest::InitIrisUnitTest(vargv);
        IUTEST_EXPECT_EQ(17u, vargv.size()) << ::iutest::PrintToString(vargv);
        IUTEST_EXPECT_TRUE(::iutest::TestFlag::IsEnableFlag(::iutest::TestFlag::SHOW_HELP));
        if( IUTEST_RUN_ALL_TESTS() != 0 ) return 1;
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}